

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O0

uint __thiscall agg::gsv_text::vertex(gsv_text *this,double *x,double *y)

{
  char cVar1;
  byte bVar2;
  int8 *piVar3;
  char *pcVar4;
  byte *pbVar5;
  bool bVar6;
  int16u iVar7;
  double local_58;
  bool quit;
  int dy;
  int dx;
  int8 yf;
  int8 yc;
  uint idx;
  double *y_local;
  double *x_local;
  gsv_text *this_local;
  
  bVar6 = false;
  do {
    if (bVar6) {
      return 0;
    }
    switch(this->m_status) {
    case initial:
      if (this->m_font == (void *)0x0) {
        bVar6 = true;
        break;
      }
      this->m_status = next_char;
    case next_char:
      if (*this->m_cur_chr == '\0') {
        bVar6 = true;
      }
      else {
        pbVar5 = (byte *)this->m_cur_chr;
        this->m_cur_chr = (char *)(pbVar5 + 1);
        bVar2 = *pbVar5;
        if (bVar2 != 10) {
          piVar3 = this->m_glyphs;
          iVar7 = value(this,this->m_indices + (ulong)bVar2 * 2);
          this->m_bglyph = piVar3 + (int)(uint)iVar7;
          piVar3 = this->m_glyphs;
          iVar7 = value(this,this->m_indices + (ulong)bVar2 * 2 + 2);
          this->m_eglyph = piVar3 + (int)(uint)iVar7;
          this->m_status = start_glyph;
          goto switchD_001484a5_caseD_2;
        }
        this->m_x = this->m_start_x;
        if ((this->m_flip & 1U) == 0) {
          local_58 = this->m_height + this->m_line_space;
        }
        else {
          local_58 = -this->m_height - this->m_line_space;
        }
        this->m_y = this->m_y - local_58;
      }
      break;
    case start_glyph:
switchD_001484a5_caseD_2:
      *x = this->m_x;
      *y = this->m_y;
      this->m_status = glyph;
      return 1;
    case glyph:
      if (this->m_bglyph < this->m_eglyph) {
        pcVar4 = this->m_bglyph;
        this->m_bglyph = pcVar4 + 1;
        cVar1 = *pcVar4;
        pbVar5 = (byte *)this->m_bglyph;
        this->m_bglyph = (int8 *)(pbVar5 + 1);
        bVar2 = *pbVar5;
        this->m_x = (double)(int)cVar1 * this->m_w + this->m_x;
        this->m_y = (double)(int)((char)(bVar2 << 1) >> 1) * this->m_h + this->m_y;
        *x = this->m_x;
        *y = this->m_y;
        if ((bVar2 & 0x80) == 0) {
          return 2;
        }
        return 1;
      }
      this->m_status = next_char;
      this->m_x = this->m_space + this->m_x;
    }
  } while( true );
}

Assistant:

unsigned gsv_text::vertex(double* x, double* y)
    {
        unsigned idx;
        int8 yc, yf;
        int dx, dy;
        bool quit = false;
        
        while(!quit)
        {
            switch(m_status)
            {
            case initial:
                if(m_font == 0) 
                {
                    quit = true;
                    break;
                }
                m_status = next_char;

            case next_char:
                if(*m_cur_chr == 0) 
                {
                    quit = true;
                    break;
                }
                idx = (*m_cur_chr++) & 0xFF;
                if(idx == '\n')
                {
                    m_x = m_start_x;
                    m_y -= m_flip ? -m_height - m_line_space : m_height + m_line_space;
                    break;
                }
                idx <<= 1;
                m_bglyph = m_glyphs + value(m_indices + idx);
                m_eglyph = m_glyphs + value(m_indices + idx + 2);
                m_status = start_glyph;

            case start_glyph:
                *x = m_x;
                *y = m_y;
                m_status = glyph;
                return path_cmd_move_to;

            case glyph:
                if(m_bglyph >= m_eglyph)
                {
                    m_status = next_char;
                    m_x += m_space;
                    break;
                }
                dx = int(*m_bglyph++);
                yf = (yc = *m_bglyph++) & 0x80;
                yc <<= 1; 
                yc >>= 1;
                dy = int(yc);
                m_x += double(dx) * m_w;
                m_y += double(dy) * m_h;
                *x = m_x;
                *y = m_y;
                return yf ? path_cmd_move_to : path_cmd_line_to;
            }

        }
        return path_cmd_stop;
    }